

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nagel.c
# Opt level: O2

float dt(qnode_ptr_t c,qnode_ptr_t q,int x,int y)

{
  long lVar1;
  long lVar2;
  float fVar3;
  
  fVar3 = 0.0;
  lVar2 = 0;
  for (lVar1 = (long)-(C.m / 2); lVar1 <= C.m / 2; lVar1 = lVar1 + 1) {
    fVar3 = fVar3 + *(float *)(*(long *)((long)c->gauss_ptr + lVar2 * 2) +
                              (long)(c->res * x + y) * 4) * *(float *)((long)C.k + lVar2);
    lVar2 = lVar2 + 4;
  }
  return fVar3 / C.f;
}

Assistant:

float dt(c,q,x,y)
qnode_ptr_t c, q ;
int x, y ;

{ extern kernel_t C ;
  float d ;
  int i, k, h ;

  h = C.m/2 ;
  k = c->sizz/2 ;

  d = 0.0 ;
 for (i = -h ; i <= h ; i++) {
    d += (*c->gauss_ptr[i+h])[c->res*x + y]*C.k[i+h] ;
  }
  d /= C.f ;
  return(d) ;
}